

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::GenerateDestructorCode
          (StringOneofFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = "if (has_$name$()) {\n  $oneof_prefix$$name$_.DestroyNoArena($default_variable$);\n}\n";
  if (*(char *)(*(long *)(*(long *)((this->super_StringFieldGenerator).descriptor_ + 0x30) + 0xa0) +
               0xa7) != '\0') {
    text = 
    "if (has_$name$()) {\n  $oneof_prefix$$name$_.Destroy($default_variable$,\n      GetArenaNoVirtual());\n}\n"
    ;
  }
  io::Printer::Print(printer,&(this->super_StringFieldGenerator).variables_,text);
  return;
}

Assistant:

void StringOneofFieldGenerator::
GenerateDestructorCode(io::Printer* printer) const {
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
      "if (has_$name$()) {\n"
      "  $oneof_prefix$$name$_.Destroy($default_variable$,\n"
      "      GetArenaNoVirtual());\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "if (has_$name$()) {\n"
      "  $oneof_prefix$$name$_.DestroyNoArena($default_variable$);\n"
      "}\n");
  }
}